

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaBuildAContentModel(xmlSchemaParserCtxtPtr pctxt,xmlSchemaParticlePtr particle)

{
  xmlSchemaTreeItemPtr_conflict pxVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  xmlAutomataStatePtr pxVar5;
  xmlAutomataStatePtr pxVar6;
  xmlChar *pxVar7;
  xmlAutomataStatePtr pxVar8;
  xmlAutomataStatePtr pxVar9;
  xmlSchemaTreeItemPtr pxVar10;
  int iVar11;
  xmlAutomataPtr pxVar12;
  xmlChar *in_R8;
  xmlSchemaTreeItemPtr_conflict *ppxVar13;
  xmlSchemaParticlePtr pxVar14;
  
  if (particle == (xmlSchemaParticlePtr)0x0) {
    xmlSchemaInternalErr
              ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaBuildAContentModel","particle is NULL");
    return 1;
  }
  pxVar1 = particle->children;
  if (pxVar1 == (xmlSchemaTreeItemPtr_conflict)0x0) {
    return 1;
  }
  switch(pxVar1->type) {
  case XML_SCHEMA_TYPE_SEQUENCE:
    iVar11 = particle->minOccurs;
    iVar3 = particle->maxOccurs;
    if (iVar11 == 1) {
      if (iVar3 == 1) {
        iVar11 = 1;
        ppxVar13 = &pxVar1->children;
        while (pxVar14 = (xmlSchemaParticlePtr)*ppxVar13, pxVar14 != (xmlSchemaParticlePtr)0x0) {
          iVar3 = xmlSchemaBuildAContentModel(pctxt,pxVar14);
          if (iVar3 == 0) {
            iVar11 = 0;
          }
          ppxVar13 = &pxVar14->next;
        }
        return iVar11;
      }
      pxVar9 = pctxt->state;
      if (0x3fffffff < iVar3) {
LAB_0019cc36:
        pxVar9 = xmlAutomataNewEpsilon(pctxt->am,pxVar9,(xmlAutomataStatePtr)0x0);
        pctxt->state = pxVar9;
        iVar11 = 1;
        ppxVar13 = &particle->children->children;
        while (pxVar14 = (xmlSchemaParticlePtr)*ppxVar13, pxVar14 != (xmlSchemaParticlePtr)0x0) {
          iVar3 = xmlSchemaBuildAContentModel(pctxt,pxVar14);
          if (iVar3 == 0) {
            iVar11 = 0;
          }
          ppxVar13 = &pxVar14->next;
        }
        xmlAutomataNewEpsilon(pctxt->am,pctxt->state,pxVar9);
        pxVar5 = xmlAutomataNewEpsilon(pctxt->am,pctxt->state,(xmlAutomataStatePtr)0x0);
        pctxt->state = pxVar5;
        if (particle->minOccurs != 0) {
          return iVar11;
        }
        pxVar12 = pctxt->am;
        goto LAB_0019cf76;
      }
LAB_0019cc7e:
      if (iVar11 < 2 && iVar3 < 2) {
        iVar11 = 1;
        ppxVar13 = &pxVar1->children;
        while (pxVar14 = (xmlSchemaParticlePtr)*ppxVar13, pxVar14 != (xmlSchemaParticlePtr)0x0) {
          iVar3 = xmlSchemaBuildAContentModel(pctxt,pxVar14);
          if (iVar3 == 0) {
            iVar11 = 0;
          }
          ppxVar13 = &pxVar14->next;
        }
        pxVar5 = xmlAutomataNewEpsilon(pctxt->am,pctxt->state,(xmlAutomataStatePtr)0x0);
        pctxt->state = pxVar5;
        if (particle->minOccurs != 0) {
          return iVar11;
        }
        pxVar12 = pctxt->am;
        goto LAB_0019cf76;
      }
      pxVar9 = xmlAutomataNewEpsilon(pctxt->am,pxVar9,(xmlAutomataStatePtr)0x0);
      pctxt->state = pxVar9;
      iVar11 = xmlAutomataNewCounter(pctxt->am,particle->minOccurs + -1,particle->maxOccurs + -1);
      bVar2 = true;
      ppxVar13 = &particle->children->children;
      while (pxVar14 = (xmlSchemaParticlePtr)*ppxVar13, pxVar14 != (xmlSchemaParticlePtr)0x0) {
        iVar3 = xmlSchemaBuildAContentModel(pctxt,pxVar14);
        if (iVar3 == 0) {
          bVar2 = false;
        }
        ppxVar13 = &pxVar14->next;
      }
      pxVar5 = pctxt->state;
      xmlAutomataNewCountedTrans(pctxt->am,pxVar5,pxVar9,iVar11);
      pxVar5 = xmlAutomataNewCounterTrans(pctxt->am,pxVar5,(xmlAutomataStatePtr)0x0,iVar11);
      pctxt->state = pxVar5;
      if ((particle->minOccurs != 0) && (!bVar2)) {
        return 0;
      }
    }
    else {
      pxVar9 = pctxt->state;
      if (iVar3 < 0x40000000) goto LAB_0019cc7e;
      if (iVar11 < 2) goto LAB_0019cc36;
      pxVar9 = xmlAutomataNewEpsilon(pctxt->am,pxVar9,(xmlAutomataStatePtr)0x0);
      pctxt->state = pxVar9;
      iVar3 = xmlAutomataNewCounter(pctxt->am,particle->minOccurs + -1,0x40000000);
      iVar11 = 1;
      ppxVar13 = &particle->children->children;
      while (pxVar14 = (xmlSchemaParticlePtr)*ppxVar13, pxVar14 != (xmlSchemaParticlePtr)0x0) {
        iVar4 = xmlSchemaBuildAContentModel(pctxt,pxVar14);
        if (iVar4 == 0) {
          iVar11 = 0;
        }
        ppxVar13 = &pxVar14->next;
      }
      pxVar5 = pctxt->state;
      xmlAutomataNewCountedTrans(pctxt->am,pxVar5,pxVar9,iVar3);
      pxVar5 = xmlAutomataNewCounterTrans(pctxt->am,pxVar5,(xmlAutomataStatePtr)0x0,iVar3);
      pctxt->state = pxVar5;
      if (iVar11 != 1) {
        return iVar11;
      }
    }
    pxVar12 = pctxt->am;
LAB_0019cf76:
    xmlAutomataNewEpsilon(pxVar12,pxVar9,pxVar5);
    return 1;
  case XML_SCHEMA_TYPE_CHOICE:
    pxVar9 = pctxt->state;
    pxVar5 = xmlAutomataNewState(pctxt->am);
    iVar3 = particle->maxOccurs;
    if (iVar3 == 0x40000000) {
LAB_0019cad8:
      iVar4 = particle->minOccurs + -1;
      iVar11 = 0;
      if (particle->minOccurs < 1) {
        iVar4 = 0;
      }
      iVar3 = xmlAutomataNewCounter(pctxt->am,iVar4,iVar3);
      pxVar6 = xmlAutomataNewState(pctxt->am);
      pxVar8 = xmlAutomataNewState(pctxt->am);
      ppxVar13 = &particle->children->children;
      while (pxVar14 = (xmlSchemaParticlePtr)*ppxVar13, pxVar14 != (xmlSchemaParticlePtr)0x0) {
        pctxt->state = pxVar8;
        iVar4 = xmlSchemaBuildAContentModel(pctxt,pxVar14);
        if (iVar4 != 0) {
          iVar11 = 1;
        }
        xmlAutomataNewEpsilon(pctxt->am,pctxt->state,pxVar6);
        ppxVar13 = &pxVar14->next;
      }
      xmlAutomataNewEpsilon(pctxt->am,pxVar9,pxVar8);
      xmlAutomataNewCountedTrans(pctxt->am,pxVar6,pxVar8,iVar3);
      xmlAutomataNewCounterTrans(pctxt->am,pxVar6,pxVar5,iVar3);
      if (iVar11 == 1) {
        xmlAutomataNewEpsilon(pctxt->am,pxVar8,pxVar5);
        iVar11 = 1;
      }
    }
    else {
      if (iVar3 != 1) {
        iVar3 = iVar3 + -1;
        goto LAB_0019cad8;
      }
      iVar11 = 0;
      ppxVar13 = &particle->children->children;
      while (pxVar14 = (xmlSchemaParticlePtr)*ppxVar13, pxVar14 != (xmlSchemaParticlePtr)0x0) {
        pctxt->state = pxVar9;
        iVar3 = xmlSchemaBuildAContentModel(pctxt,pxVar14);
        if (iVar3 != 0) {
          iVar11 = 1;
        }
        xmlAutomataNewEpsilon(pctxt->am,pctxt->state,pxVar5);
        ppxVar13 = &pxVar14->next;
      }
    }
    if (particle->minOccurs != 0) goto LAB_0019d05b;
    pxVar12 = pctxt->am;
    break;
  case XML_SCHEMA_TYPE_ALL:
    pxVar14 = (xmlSchemaParticlePtr)pxVar1->children;
    if (pxVar14 == (xmlSchemaParticlePtr)0x0) {
      return 1;
    }
    pxVar9 = pctxt->state;
    pxVar5 = xmlAutomataNewState(pctxt->am);
    xmlAutomataNewEpsilon(pctxt->am,pctxt->state,pxVar5);
    pctxt->state = pxVar5;
    for (; pxVar14 != (xmlSchemaParticlePtr)0x0; pxVar14 = (xmlSchemaParticlePtr)pxVar14->next) {
      pctxt->state = pxVar5;
      pxVar1 = pxVar14->children;
      if (pxVar1 == (xmlSchemaTreeItemPtr_conflict)0x0) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaBuildAContentModel",
                   "<element> particle has no term");
        return 0;
      }
      if (((ulong)pxVar1[2].children & 0x20000) == 0) {
        if (pxVar14->minOccurs == 0) {
          if (pxVar14->maxOccurs == 1) {
            xmlAutomataNewCountTrans2
                      (pctxt->am,pxVar5,pxVar5,(xmlChar *)pxVar1->next,*(xmlChar **)(pxVar1 + 3),0,1
                       ,pxVar1);
          }
        }
        else if ((pxVar14->minOccurs == 1) && (pxVar14->maxOccurs == 1)) {
          xmlAutomataNewOnceTrans2
                    (pctxt->am,pxVar5,pxVar5,(xmlChar *)pxVar1->next,*(xmlChar **)(pxVar1 + 3),1,1,
                     pxVar1);
        }
      }
      else {
        iVar11 = xmlAutomataNewCounter(pctxt->am,pxVar14->minOccurs,pxVar14->maxOccurs);
        xmlSchemaBuildContentModelForSubstGroup(pctxt,pxVar14,iVar11,pctxt->state);
      }
    }
    pxVar5 = xmlAutomataNewAllTrans(pctxt->am,pctxt->state,(xmlAutomataStatePtr)0x0,0);
    pctxt->state = pxVar5;
    if (particle->minOccurs != 0) {
      return 0;
    }
    pxVar12 = pctxt->am;
    goto LAB_0019d126;
  case XML_SCHEMA_TYPE_SIMPLE_CONTENT:
  case XML_SCHEMA_TYPE_COMPLEX_CONTENT:
  case XML_SCHEMA_TYPE_UR:
  case XML_SCHEMA_TYPE_RESTRICTION:
  case XML_SCHEMA_TYPE_EXTENSION:
  case XML_SCHEMA_TYPE_ATTRIBUTE:
  case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
switchD_0019c73b_caseD_9:
    pxVar7 = xmlSchemaGetComponentTypeStr((xmlSchemaBasicItemPtr)pxVar1);
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaBuildAContentModel",
               "found unexpected term of type \'%s\' in content model",pxVar7,in_R8);
    return 0;
  case XML_SCHEMA_TYPE_ELEMENT:
    if ((*(uint *)&pxVar1[2].children >> 0x11 & 1) != 0) {
      iVar11 = xmlSchemaBuildContentModelForSubstGroup(pctxt,particle,-1,(xmlAutomataStatePtr)0x0);
      return iVar11;
    }
    if ((*(uint *)&pxVar1[2].children & 0x10) != 0) {
      return 0;
    }
    iVar11 = particle->maxOccurs;
    if (iVar11 == 1) {
      pxVar12 = pctxt->am;
      pxVar9 = pctxt->state;
      pxVar10 = pxVar1->next;
      pxVar7 = *(xmlChar **)(pxVar1 + 3);
      pxVar6 = (xmlAutomataStatePtr)0x0;
      pxVar5 = pxVar9;
LAB_0019cf29:
      pxVar5 = xmlAutomataNewTransition2(pxVar12,pxVar5,pxVar6,(xmlChar *)pxVar10,pxVar7,pxVar1);
    }
    else {
      iVar3 = particle->minOccurs;
      if (iVar3 < 2 && 0x3fffffff < iVar11) {
        pxVar9 = pctxt->state;
        pxVar6 = xmlAutomataNewTransition2
                           (pctxt->am,pxVar9,(xmlAutomataStatePtr)0x0,(xmlChar *)pxVar1->next,
                            *(xmlChar **)(pxVar1 + 3),pxVar1);
        pctxt->state = pxVar6;
        pxVar12 = pctxt->am;
        pxVar10 = pxVar1->next;
        pxVar7 = *(xmlChar **)(pxVar1 + 3);
        pxVar5 = pxVar6;
        goto LAB_0019cf29;
      }
      iVar4 = iVar11 + -1;
      if (iVar11 == 0x40000000) {
        iVar4 = 0x40000000;
      }
      iVar11 = iVar3 + -1;
      if (iVar3 < 1) {
        iVar11 = 0;
      }
      pxVar9 = xmlAutomataNewEpsilon(pctxt->am,pctxt->state,(xmlAutomataStatePtr)0x0);
      iVar11 = xmlAutomataNewCounter(pctxt->am,iVar11,iVar4);
      pxVar5 = xmlAutomataNewTransition2
                         (pctxt->am,pxVar9,(xmlAutomataStatePtr)0x0,(xmlChar *)pxVar1->next,
                          *(xmlChar **)(pxVar1 + 3),pxVar1);
      pctxt->state = pxVar5;
      xmlAutomataNewCountedTrans(pctxt->am,pxVar5,pxVar9,iVar11);
      pxVar5 = xmlAutomataNewCounterTrans(pctxt->am,pctxt->state,(xmlAutomataStatePtr)0x0,iVar11);
    }
    pctxt->state = pxVar5;
    if (particle->minOccurs != 0) {
      return 0;
    }
    pxVar12 = pctxt->am;
LAB_0019d126:
    xmlAutomataNewEpsilon(pxVar12,pxVar9,pxVar5);
LAB_0019c798:
    return 1;
  case XML_SCHEMA_TYPE_GROUP:
    goto LAB_0019c798;
  default:
    if (pxVar1->type != XML_SCHEMA_TYPE_ANY) goto switchD_0019c73b_caseD_9;
    pxVar9 = pctxt->state;
    pxVar5 = xmlAutomataNewState(pctxt->am);
    iVar11 = particle->maxOccurs;
    if (iVar11 == 0x40000000) {
LAB_0019cd3a:
      iVar3 = 0;
      if (0 < particle->minOccurs) {
        iVar3 = particle->minOccurs + -1;
      }
      iVar11 = xmlAutomataNewCounter(pctxt->am,iVar3,iVar11);
      pxVar6 = xmlAutomataNewState(pctxt->am);
      if (*(int *)((long)&pxVar1[1].annot + 4) == 1) {
        pxVar8 = xmlAutomataNewTransition2(pctxt->am,pxVar9,(xmlAutomataStatePtr)0x0,"*","*",pxVar1)
        ;
        pctxt->state = pxVar8;
        xmlAutomataNewEpsilon(pctxt->am,pxVar8,pxVar6);
        pxVar8 = xmlAutomataNewTransition2
                           (pctxt->am,pxVar9,(xmlAutomataStatePtr)0x0,"*",(xmlChar *)0x0,pxVar1);
        pctxt->state = pxVar8;
        xmlAutomataNewEpsilon(pctxt->am,pxVar8,pxVar6);
      }
      else {
        pxVar10 = pxVar1[1].next;
        if (pxVar10 == (xmlSchemaTreeItemPtr)0x0) {
          if (pxVar1[1].children != (xmlSchemaTreeItemPtr)0x0) {
            pxVar8 = xmlAutomataNewNegTrans
                               (pctxt->am,pxVar9,pxVar6,"*",(xmlChar *)(pxVar1[1].children)->annot,
                                pxVar1);
            pctxt->state = pxVar8;
          }
        }
        else {
          do {
            pxVar8 = xmlAutomataNewTransition2
                               (pctxt->am,pxVar9,(xmlAutomataStatePtr)0x0,"*",
                                (xmlChar *)pxVar10->annot,pxVar1);
            pctxt->state = pxVar8;
            xmlAutomataNewEpsilon(pctxt->am,pxVar8,pxVar6);
            pxVar10 = *(xmlSchemaTreeItemPtr *)pxVar10;
          } while (pxVar10 != (xmlSchemaTreeItemPtr)0x0);
        }
      }
      xmlAutomataNewCountedTrans(pctxt->am,pxVar6,pxVar9,iVar11);
      xmlAutomataNewCounterTrans(pctxt->am,pxVar6,pxVar5,iVar11);
    }
    else {
      if (iVar11 != 1) {
        iVar11 = iVar11 + -1;
        goto LAB_0019cd3a;
      }
      if (*(int *)((long)&pxVar1[1].annot + 4) == 1) {
        pxVar6 = xmlAutomataNewTransition2(pctxt->am,pxVar9,(xmlAutomataStatePtr)0x0,"*","*",pxVar1)
        ;
        pctxt->state = pxVar6;
        xmlAutomataNewEpsilon(pctxt->am,pxVar6,pxVar5);
        pxVar6 = xmlAutomataNewTransition2
                           (pctxt->am,pxVar9,(xmlAutomataStatePtr)0x0,"*",(xmlChar *)0x0,pxVar1);
        pctxt->state = pxVar6;
        xmlAutomataNewEpsilon(pctxt->am,pxVar6,pxVar5);
      }
      else {
        pxVar10 = pxVar1[1].next;
        if (pxVar10 == (xmlSchemaTreeItemPtr)0x0) {
          if (pxVar1[1].children != (xmlSchemaTreeItemPtr)0x0) {
            pxVar6 = xmlAutomataNewNegTrans
                               (pctxt->am,pxVar9,pxVar5,"*",(xmlChar *)(pxVar1[1].children)->annot,
                                pxVar1);
            pctxt->state = pxVar6;
          }
        }
        else {
          do {
            pctxt->state = pxVar9;
            pxVar6 = xmlAutomataNewTransition2
                               (pctxt->am,pxVar9,(xmlAutomataStatePtr)0x0,"*",
                                (xmlChar *)pxVar10->annot,pxVar1);
            pctxt->state = pxVar6;
            xmlAutomataNewEpsilon(pctxt->am,pxVar6,pxVar5);
            pxVar10 = *(xmlSchemaTreeItemPtr *)pxVar10;
          } while (pxVar10 != (xmlSchemaTreeItemPtr)0x0);
        }
      }
    }
    iVar11 = 0;
    if (particle->minOccurs != 0) goto LAB_0019d05b;
    pxVar12 = pctxt->am;
  }
  xmlAutomataNewEpsilon(pxVar12,pxVar9,pxVar5);
  iVar11 = 1;
LAB_0019d05b:
  pctxt->state = pxVar5;
  return iVar11;
}

Assistant:

static int
xmlSchemaBuildAContentModel(xmlSchemaParserCtxtPtr pctxt,
			    xmlSchemaParticlePtr particle)
{
    int ret = 0, tmp2;

    if (particle == NULL) {
	PERROR_INT("xmlSchemaBuildAContentModel", "particle is NULL");
	return(1);
    }
    if (particle->children == NULL) {
	/*
	* Just return in this case. A missing "term" of the particle
	* might arise due to an invalid "term" component.
	*/
	return(1);
    }

    switch (particle->children->type) {
	case XML_SCHEMA_TYPE_ANY: {
	    xmlAutomataStatePtr start, end;
	    xmlSchemaWildcardPtr wild;
	    xmlSchemaWildcardNsPtr ns;

	    wild = (xmlSchemaWildcardPtr) particle->children;

	    start = pctxt->state;
	    end = xmlAutomataNewState(pctxt->am);

	    if (particle->maxOccurs == 1) {
		if (wild->any == 1) {
		    /*
		    * We need to add both transitions:
		    *
		    * 1. the {"*", "*"} for elements in a namespace.
		    */
		    pctxt->state =
			xmlAutomataNewTransition2(pctxt->am,
			start, NULL, BAD_CAST "*", BAD_CAST "*", wild);
		    xmlAutomataNewEpsilon(pctxt->am, pctxt->state, end);
		    /*
		    * 2. the {"*"} for elements in no namespace.
		    */
		    pctxt->state =
			xmlAutomataNewTransition2(pctxt->am,
			start, NULL, BAD_CAST "*", NULL, wild);
		    xmlAutomataNewEpsilon(pctxt->am, pctxt->state, end);

		} else if (wild->nsSet != NULL) {
		    ns = wild->nsSet;
		    do {
			pctxt->state = start;
			pctxt->state = xmlAutomataNewTransition2(pctxt->am,
			    pctxt->state, NULL, BAD_CAST "*", ns->value, wild);
			xmlAutomataNewEpsilon(pctxt->am, pctxt->state, end);
			ns = ns->next;
		    } while (ns != NULL);

		} else if (wild->negNsSet != NULL) {
		    pctxt->state = xmlAutomataNewNegTrans(pctxt->am,
			start, end, BAD_CAST "*", wild->negNsSet->value,
			wild);
		}
	    } else {
		int counter;
		xmlAutomataStatePtr hop;
		int maxOccurs =
		    particle->maxOccurs == UNBOUNDED ? UNBOUNDED :
                                           particle->maxOccurs - 1;
		int minOccurs =
		    particle->minOccurs < 1 ? 0 : particle->minOccurs - 1;

		counter = xmlAutomataNewCounter(pctxt->am, minOccurs, maxOccurs);
		hop = xmlAutomataNewState(pctxt->am);
		if (wild->any == 1) {
		    pctxt->state =
			xmlAutomataNewTransition2(pctxt->am,
			start, NULL, BAD_CAST "*", BAD_CAST "*", wild);
		    xmlAutomataNewEpsilon(pctxt->am, pctxt->state, hop);
		    pctxt->state =
			xmlAutomataNewTransition2(pctxt->am,
			start, NULL, BAD_CAST "*", NULL, wild);
		    xmlAutomataNewEpsilon(pctxt->am, pctxt->state, hop);
		} else if (wild->nsSet != NULL) {
		    ns = wild->nsSet;
		    do {
			pctxt->state =
			    xmlAutomataNewTransition2(pctxt->am,
				start, NULL, BAD_CAST "*", ns->value, wild);
			xmlAutomataNewEpsilon(pctxt->am, pctxt->state, hop);
			ns = ns->next;
		    } while (ns != NULL);

		} else if (wild->negNsSet != NULL) {
		    pctxt->state = xmlAutomataNewNegTrans(pctxt->am,
			start, hop, BAD_CAST "*", wild->negNsSet->value,
			wild);
		}
		xmlAutomataNewCountedTrans(pctxt->am, hop, start, counter);
		xmlAutomataNewCounterTrans(pctxt->am, hop, end, counter);
	    }
	    if (particle->minOccurs == 0) {
		xmlAutomataNewEpsilon(pctxt->am, start, end);
                ret = 1;
	    }
	    pctxt->state = end;
            break;
	}
        case XML_SCHEMA_TYPE_ELEMENT:
	    ret = xmlSchemaBuildContentModelForElement(pctxt, particle);
	    break;
        case XML_SCHEMA_TYPE_SEQUENCE:{
            xmlSchemaTreeItemPtr sub;

            ret = 1;
            /*
             * If max and min occurrences are default (1) then
             * simply iterate over the particles of the <sequence>.
             */
            if ((particle->minOccurs == 1) && (particle->maxOccurs == 1)) {
                sub = particle->children->children;

                while (sub != NULL) {
                    tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                        (xmlSchemaParticlePtr) sub);
                    if (tmp2 != 1) ret = 0;
                    sub = sub->next;
                }
            } else {
                xmlAutomataStatePtr oldstate = pctxt->state;

                if (particle->maxOccurs >= UNBOUNDED) {
                    if (particle->minOccurs > 1) {
                        xmlAutomataStatePtr tmp;
                        int counter;

                        pctxt->state = xmlAutomataNewEpsilon(pctxt->am,
                            oldstate, NULL);
                        oldstate = pctxt->state;

                        counter = xmlAutomataNewCounter(pctxt->am,
                            particle->minOccurs - 1, UNBOUNDED);

                        sub = particle->children->children;
                        while (sub != NULL) {
                            tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                            (xmlSchemaParticlePtr) sub);
                            if (tmp2 != 1) ret = 0;
                            sub = sub->next;
                        }
                        tmp = pctxt->state;
                        xmlAutomataNewCountedTrans(pctxt->am, tmp,
                                                   oldstate, counter);
                        pctxt->state =
                            xmlAutomataNewCounterTrans(pctxt->am, tmp,
                                                       NULL, counter);
                        if (ret == 1)
                            xmlAutomataNewEpsilon(pctxt->am,
                                                oldstate, pctxt->state);

                    } else {
                        pctxt->state = xmlAutomataNewEpsilon(pctxt->am,
                            oldstate, NULL);
                        oldstate = pctxt->state;

                        sub = particle->children->children;
                        while (sub != NULL) {
                            tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                        (xmlSchemaParticlePtr) sub);
                            if (tmp2 != 1) ret = 0;
                            sub = sub->next;
                        }
                        xmlAutomataNewEpsilon(pctxt->am, pctxt->state,
                                              oldstate);
                        /*
                         * epsilon needed to block previous trans from
                         * being allowed to enter back from another
                         * construct
                         */
                        pctxt->state = xmlAutomataNewEpsilon(pctxt->am,
                                            pctxt->state, NULL);
                        if (particle->minOccurs == 0) {
                            xmlAutomataNewEpsilon(pctxt->am,
                                oldstate, pctxt->state);
                            ret = 1;
                        }
                    }
                } else if ((particle->maxOccurs > 1)
                           || (particle->minOccurs > 1)) {
                    xmlAutomataStatePtr tmp;
                    int counter;

                    pctxt->state = xmlAutomataNewEpsilon(pctxt->am,
                        oldstate, NULL);
                    oldstate = pctxt->state;

                    counter = xmlAutomataNewCounter(pctxt->am,
                        particle->minOccurs - 1,
                        particle->maxOccurs - 1);

                    sub = particle->children->children;
                    while (sub != NULL) {
                        tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                        (xmlSchemaParticlePtr) sub);
                        if (tmp2 != 1) ret = 0;
                        sub = sub->next;
                    }
                    tmp = pctxt->state;
                    xmlAutomataNewCountedTrans(pctxt->am,
                        tmp, oldstate, counter);
                    pctxt->state =
                        xmlAutomataNewCounterTrans(pctxt->am, tmp, NULL,
                                                   counter);
                    if ((particle->minOccurs == 0) || (ret == 1)) {
                        xmlAutomataNewEpsilon(pctxt->am,
                                            oldstate, pctxt->state);
                        ret = 1;
                    }
                } else {
                    sub = particle->children->children;
                    while (sub != NULL) {
                        tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                        (xmlSchemaParticlePtr) sub);
                        if (tmp2 != 1) ret = 0;
                        sub = sub->next;
                    }

		    /*
		     * epsilon needed to block previous trans from
		     * being allowed to enter back from another
		     * construct
		     */
		    pctxt->state = xmlAutomataNewEpsilon(pctxt->am,
					pctxt->state, NULL);

                    if (particle->minOccurs == 0) {
                        xmlAutomataNewEpsilon(pctxt->am, oldstate,
                                              pctxt->state);
                        ret = 1;
                    }
                }
            }
            break;
        }
        case XML_SCHEMA_TYPE_CHOICE:{
            xmlSchemaTreeItemPtr sub;
            xmlAutomataStatePtr start, end;

            ret = 0;
            start = pctxt->state;
            end = xmlAutomataNewState(pctxt->am);

            /*
             * iterate over the subtypes and remerge the end with an
             * epsilon transition
             */
            if (particle->maxOccurs == 1) {
                sub = particle->children->children;
                while (sub != NULL) {
                    pctxt->state = start;
                    tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                        (xmlSchemaParticlePtr) sub);
                    if (tmp2 == 1) ret = 1;
                    xmlAutomataNewEpsilon(pctxt->am, pctxt->state, end);
                    sub = sub->next;
                }
            } else {
                int counter;
                xmlAutomataStatePtr hop, base;
                int maxOccurs = particle->maxOccurs == UNBOUNDED ?
                    UNBOUNDED : particle->maxOccurs - 1;
                int minOccurs =
                    particle->minOccurs < 1 ? 0 : particle->minOccurs - 1;

                /*
                 * use a counter to keep track of the number of transitions
                 * which went through the choice.
                 */
                counter =
                    xmlAutomataNewCounter(pctxt->am, minOccurs, maxOccurs);
                hop = xmlAutomataNewState(pctxt->am);
                base = xmlAutomataNewState(pctxt->am);

                sub = particle->children->children;
                while (sub != NULL) {
                    pctxt->state = base;
                    tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                        (xmlSchemaParticlePtr) sub);
                    if (tmp2 == 1) ret = 1;
                    xmlAutomataNewEpsilon(pctxt->am, pctxt->state, hop);
                    sub = sub->next;
                }
                xmlAutomataNewEpsilon(pctxt->am, start, base);
                xmlAutomataNewCountedTrans(pctxt->am, hop, base, counter);
                xmlAutomataNewCounterTrans(pctxt->am, hop, end, counter);
                if (ret == 1)
                    xmlAutomataNewEpsilon(pctxt->am, base, end);
            }
            if (particle->minOccurs == 0) {
                xmlAutomataNewEpsilon(pctxt->am, start, end);
                ret = 1;
            }
            pctxt->state = end;
            break;
        }
        case XML_SCHEMA_TYPE_ALL:{
            xmlAutomataStatePtr start, tmp;
            xmlSchemaParticlePtr sub;
            xmlSchemaElementPtr elemDecl;

            ret = 1;

            sub = (xmlSchemaParticlePtr) particle->children->children;
            if (sub == NULL)
                break;

            ret = 0;

            start = pctxt->state;
            tmp = xmlAutomataNewState(pctxt->am);
            xmlAutomataNewEpsilon(pctxt->am, pctxt->state, tmp);
            pctxt->state = tmp;
            while (sub != NULL) {
                pctxt->state = tmp;

                elemDecl = (xmlSchemaElementPtr) sub->children;
                if (elemDecl == NULL) {
                    PERROR_INT("xmlSchemaBuildAContentModel",
                        "<element> particle has no term");
                    return(ret);
                };
                /*
                * NOTE: The {max occurs} of all the particles in the
                * {particles} of the group must be 0 or 1; this is
                * already ensured during the parse of the content of
                * <all>.
                */
                if (elemDecl->flags & XML_SCHEMAS_ELEM_SUBST_GROUP_HEAD) {
                    int counter;

                    /*
                     * This is an abstract group, we need to share
                     * the same counter for all the element transitions
                     * derived from the group
                     */
                    counter = xmlAutomataNewCounter(pctxt->am,
                                       sub->minOccurs, sub->maxOccurs);
                    xmlSchemaBuildContentModelForSubstGroup(pctxt,
                                       sub, counter, pctxt->state);
                } else {
                    if ((sub->minOccurs == 1) &&
                        (sub->maxOccurs == 1)) {
                        xmlAutomataNewOnceTrans2(pctxt->am, pctxt->state,
                                                pctxt->state,
                                                elemDecl->name,
                                                elemDecl->targetNamespace,
                                                1, 1, elemDecl);
                    } else if ((sub->minOccurs == 0) &&
                        (sub->maxOccurs == 1)) {

                        xmlAutomataNewCountTrans2(pctxt->am, pctxt->state,
                                                 pctxt->state,
                                                 elemDecl->name,
                                                 elemDecl->targetNamespace,
                                                 0,
                                                 1,
                                                 elemDecl);
                    }
                }
                sub = (xmlSchemaParticlePtr) sub->next;
            }
            pctxt->state =
                xmlAutomataNewAllTrans(pctxt->am, pctxt->state, NULL, 0);
            if (particle->minOccurs == 0) {
                xmlAutomataNewEpsilon(pctxt->am, start, pctxt->state);
                ret = 1;
            }
            break;
        }
	case XML_SCHEMA_TYPE_GROUP:
	    /*
	    * If we hit a model group definition, then this means that
	    * it was empty, thus was not substituted for the containing
	    * model group. Just do nothing in this case.
	    * TODO: But the group should be substituted and not occur at
	    * all in the content model at this point. Fix this.
	    */
            ret = 1;
	    break;
        default:
	    xmlSchemaInternalErr2(ACTXT_CAST pctxt,
		"xmlSchemaBuildAContentModel",
		"found unexpected term of type '%s' in content model",
		WXS_ITEM_TYPE_NAME(particle->children), NULL);
            return(ret);
    }
    return(ret);
}